

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall libtorrent::aux::socks5::read_bindaddr(socks5 *this,error_code *e)

{
  bool bVar1;
  uint16_t port_num;
  uint32_t addr;
  pointer data;
  undefined1 local_a0 [64];
  mutable_buffer local_60;
  address_v4 local_4c;
  address local_48;
  pointer local_28;
  char *p;
  wait_op *local_18;
  error_code *e_local;
  socks5 *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    local_18 = (wait_op *)e;
    e_local = (error_code *)this;
    bVar1 = boost::system::error_code::operator_cast_to_bool(e);
    if (bVar1) {
      bVar1 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
      if (bVar1) {
        p._7_1_ = 0x28;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)((long)&p + 7),
                   (error_code *)local_18);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      local_28 = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
      addr = read_uint32<char*>(&local_28);
      boost::asio::ip::address_v4::address_v4(&local_4c,addr);
      boost::asio::ip::address::address(&local_48,&local_4c);
      boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
                (&this->m_udp_proxy_addr,&local_48);
      port_num = read_uint16<char*>(&local_28);
      boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::port(&this->m_udp_proxy_addr,port_num);
      this->m_active = true;
      this->m_failures = 0;
      data = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
      local_60 = boost::asio::buffer(data,10);
      local_a0._16_8_ = hung_up;
      local_a0._24_4_ = 0;
      local_a0[0x1c] = '\0';
      local_a0._29_3_ = 0;
      self((socks5 *)local_a0);
      ::std::
      bind<void(libtorrent::aux::socks5::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>const&>
                ((type *)(local_a0 + 0x20),(offset_in_socks5_to_subr *)(local_a0 + 0x10),
                 (shared_ptr<libtorrent::aux::socks5> *)local_a0,
                 (_Placeholder<1> *)&::std::placeholders::_1);
      boost::asio::
      async_read<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::mutable_buffer,std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                (&this->m_socks5_sock,&local_60,
                 (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                  *)(local_a0 + 0x20),(type *)0x0);
      ::std::
      _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
      ::~_Bind((_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                *)(local_a0 + 0x20));
      ::std::shared_ptr<libtorrent::aux::socks5>::~shared_ptr
                ((shared_ptr<libtorrent::aux::socks5> *)local_a0);
    }
  }
  return;
}

Assistant:

void socks5::read_bindaddr(error_code const& e)
{
	COMPLETE_ASYNC("socks5::read_bindaddr");

	if (m_abort) return;
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::aux;

	char* p = m_tmp_buf.data();
	m_udp_proxy_addr.address(address_v4(read_uint32(p)));
	m_udp_proxy_addr.port(read_uint16(p));

	// we're done!
	m_active = true;
	m_failures = 0;

	ADD_OUTSTANDING_ASYNC("socks5::hung_up");
	boost::asio::async_read(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data(), 10)
		, std::bind(&socks5::hung_up, self(), _1));
}